

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O1

Var Js::JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk
              (JavascriptFunction *function,CallInfo *callInfo,Arguments *args,
              ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  EventLog *this;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  RecyclableData *pRVar5;
  undefined4 *puVar6;
  int rootDepth;
  undefined1 local_80 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  Var local_40;
  Var result;
  
  local_40 = (Var)0x0;
  if (scriptContext->TTDShouldPerformReplayAction == true) {
    pTVar1 = scriptContext->threadContext;
    pTVar1->TTDRootNestingCount = pTVar1->TTDRootNestingCount + 1;
    TTD::EventLog::ReplayExternalCallEvent(pTVar1->TTDLog,function,args,&local_40);
  }
  else {
    if (scriptContext->TTDShouldPerformRecordAction == false) {
      TTDAbort_unrecoverable_error("Check either record/replay before calling!!!");
    }
    pTVar1 = scriptContext->threadContext;
    this = pTVar1->TTDLog;
    rootDepth = pTVar1->TTDRootNestingCount + 1;
    pTVar1->TTDRootNestingCount = rootDepth;
    __leaveScriptObject._32_8_ =
         TTD::EventLog::RecordExternalCallEvent(this,function,rootDepth,args,false);
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_80,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar2 = scriptContext->threadContext;
    result._7_1_ = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    local_40 = (Var)(*(code *)function[1].functionInfo.ptr)(function,*callInfo,args->Values);
    pRVar5 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&scriptContext->threadContext->recyclableData);
    if ((pRVar5->exceptionObject).ptr != (JavascriptExceptionObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                  ,0x18e,"(!scriptContext->HasRecordedException())",
                                  "!scriptContext->HasRecordedException()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar2->reentrancySafeOrHandled = (bool)result._7_1_;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_80);
    TTD::EventLog::RecordExternalCallEvent_Complete
              (this,function,(EventLogEntry *)__leaveScriptObject._32_8_,local_40);
  }
  pTVar1->TTDRootNestingCount = pTVar1->TTDRootNestingCount + -1;
  return local_40;
}

Assistant:

Var JavascriptExternalFunction::HandleRecordReplayExternalFunction_Thunk(Js::JavascriptFunction* function, CallInfo& callInfo, Arguments& args, ScriptContext* scriptContext)
    {
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);

        Var result = nullptr;

        if(scriptContext->ShouldPerformReplayAction())
        {
            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            scriptContext->GetThreadContext()->TTDLog->ReplayExternalCallEvent(externalFunction, args, &result);
        }
        else
        {
            TTDAssert(scriptContext->ShouldPerformRecordAction(), "Check either record/replay before calling!!!");

            TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;

            TTD::TTDNestingDepthAutoAdjuster logPopper(scriptContext->GetThreadContext());
            TTD::NSLogEvents::EventLogEntry* callEvent = elog->RecordExternalCallEvent(externalFunction, scriptContext->GetThreadContext()->TTDRootNestingCount, args, false);

            BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext)
            {
                // Don't do stack probe since BEGIN_LEAVE_SCRIPT_WITH_EXCEPTION does that for us already
                result = externalFunction->nativeMethod(function, callInfo, args.Values);
            }
            END_LEAVE_SCRIPT_WITH_EXCEPTION(scriptContext);

            //Exceptions should be prohibited so no need to do extra work
            elog->RecordExternalCallEvent_Complete(externalFunction, callEvent, result);
        }

        return result;
    }